

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

void sobel_filter(uint8_t *src,int src_stride,int16_t *dst,int dst_stride,int dir)

{
  int16_t *piVar1;
  undefined1 *puVar2;
  uint uVar3;
  undefined1 *puVar4;
  int x_1;
  int16_t *piVar5;
  short sVar6;
  long lVar7;
  int k;
  long lVar8;
  uint uVar9;
  int x;
  ulong uVar10;
  undefined1 local_d8 [16];
  short asStack_c8 [76];
  
  piVar1 = sobel_filter::sobel_b;
  piVar5 = sobel_filter::sobel_a;
  if (dst_stride == 0) {
    piVar5 = sobel_filter::sobel_b;
  }
  uVar3 = ~src_stride;
  for (lVar7 = -1; lVar7 != 9; lVar7 = lVar7 + 1) {
    uVar9 = uVar3;
    for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
      sVar6 = 0;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        sVar6 = sVar6 + (ushort)src[(int)(uVar9 + (int)lVar8)] * piVar5[lVar8];
      }
      asStack_c8[uVar10 | lVar7 * 8] = sVar6;
      uVar9 = uVar9 + 1;
    }
    uVar3 = uVar3 + src_stride;
  }
  if (dst_stride == 0) {
    piVar1 = sobel_filter::sobel_a;
  }
  puVar2 = local_d8;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    puVar4 = puVar2;
    for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
      sVar6 = 0;
      for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 2) {
        sVar6 = sVar6 + *(short *)(puVar4 + lVar8 * 8) * *(short *)((long)piVar1 + lVar8);
      }
      dst[uVar10 | lVar7 * 8] = sVar6;
      puVar4 = puVar4 + 2;
    }
    puVar2 = puVar2 + 0x10;
  }
  return;
}

Assistant:

static inline void sobel_filter(const uint8_t *src, int src_stride,
                                int16_t *dst, int dst_stride, int dir) {
  int16_t tmp_[DISFLOW_PATCH_SIZE * (DISFLOW_PATCH_SIZE + 2)];
  int16_t *tmp = tmp_ + DISFLOW_PATCH_SIZE;

  // Sobel filter kernel
  // This must have an overall scale factor equal to DISFLOW_DERIV_SCALE,
  // in order to produce correctly scaled outputs.
  // To work out the scale factor, we multiply two factors:
  //
  // * For the derivative filter (sobel_a), comparing our filter
  //    image[x - 1] - image[x + 1]
  //   to the standard form
  //    d/dx image[x] = image[x+1] - image[x]
  //   tells us that we're actually calculating -2 * d/dx image[2]
  //
  // * For the smoothing filter (sobel_b), all coefficients are positive
  //   so the scale factor is just the sum of the coefficients
  //
  // Thus we need to make sure that DISFLOW_DERIV_SCALE = 2 * sum(sobel_b)
  // (and take care of the - sign from sobel_a elsewhere)
  static const int16_t sobel_a[3] = { 1, 0, -1 };
  static const int16_t sobel_b[3] = { 1, 2, 1 };
  const int taps = 3;

  // horizontal filter
  const int16_t *h_kernel = dir ? sobel_a : sobel_b;

  for (int y = -1; y < DISFLOW_PATCH_SIZE + 1; ++y) {
    for (int x = 0; x < DISFLOW_PATCH_SIZE; ++x) {
      int sum = 0;
      for (int k = 0; k < taps; ++k) {
        sum += h_kernel[k] * src[y * src_stride + (x + k - 1)];
      }
      tmp[y * DISFLOW_PATCH_SIZE + x] = sum;
    }
  }

  // vertical filter
  const int16_t *v_kernel = dir ? sobel_b : sobel_a;

  for (int y = 0; y < DISFLOW_PATCH_SIZE; ++y) {
    for (int x = 0; x < DISFLOW_PATCH_SIZE; ++x) {
      int sum = 0;
      for (int k = 0; k < taps; ++k) {
        sum += v_kernel[k] * tmp[(y + k - 1) * DISFLOW_PATCH_SIZE + x];
      }
      dst[y * dst_stride + x] = sum;
    }
  }
}